

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.cpp
# Opt level: O3

file_mapping *
cornelich::util::create_mapping(file_mapping *__return_storage_ptr__,string *path,uint32_t size)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  ulong uVar3;
  path local_58;
  uint local_38;
  
  paVar1 = &local_58.m_pathname.field_2;
  pcVar2 = (path->_M_dataplus)._M_p;
  local_58.m_pathname._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar2,pcVar2 + path->_M_string_length);
  boost::filesystem::detail::status((path *)&local_38,(error_code *)&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.m_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(local_58.m_pathname._M_dataplus._M_p);
  }
  if (local_38 < 2) {
    touch(path);
  }
  pcVar2 = (path->_M_dataplus)._M_p;
  local_58.m_pathname._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar2,pcVar2 + path->_M_string_length);
  uVar3 = boost::filesystem::detail::file_size(&local_58,(error_code *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.m_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(local_58.m_pathname._M_dataplus._M_p);
  }
  if (uVar3 < size) {
    pcVar2 = (path->_M_dataplus)._M_p;
    local_58.m_pathname._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_58,pcVar2,pcVar2 + path->_M_string_length);
    boost::filesystem::detail::resize_file(&local_58,(ulong)size,(error_code *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58.m_pathname._M_dataplus._M_p != paVar1) {
      operator_delete(local_58.m_pathname._M_dataplus._M_p);
    }
  }
  boost::interprocess::file_mapping::file_mapping
            (__return_storage_ptr__,(path->_M_dataplus)._M_p,read_write);
  return __return_storage_ptr__;
}

Assistant:

bip::file_mapping create_mapping(const std::string & path, std::uint32_t size)
{
    if(!fs::exists(path))
    {
        touch(path);
    }
    if(fs::file_size(path) < size)
    {
        fs::resize_file(path, size);
    }
    auto mapping = bip::file_mapping(path.c_str(), bip::read_write);
    return mapping;
}